

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vehicle.cpp
# Opt level: O1

bool __thiscall Vehicle::collides_with(Vehicle *this,Vehicle *other,double time_t)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = this->m_a * time_t * time_t * 0.5 + this->m_v * time_t + this->m_s;
  dVar3 = other->m_a * time_t * time_t * 0.5 + other->m_v * time_t + other->m_s;
  if ((dVar4 == dVar3) && (!NAN(dVar4) && !NAN(dVar3))) {
    iVar1 = this->m_lane - other->m_lane;
    iVar2 = -iVar1;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    return iVar2 <= this->m_L;
  }
  return false;
}

Assistant:

bool Vehicle::collides_with(Vehicle other, double time_t)
{
	/*
    Simple collision detection.
    */
    Position vehicle_1 = position_at(time_t);
    Position vehicle_2 = other.position_at(time_t);
    return (vehicle_1.first == vehicle_2.first) && (abs(vehicle_1.second-vehicle_2.second) <= m_L);
}